

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

bool dxil_spv::execution_model_has_hit_attribute(ExecutionModel model)

{
  ExecutionModel model_local;
  
  return model - ExecutionModelIntersectionKHR < 3;
}

Assistant:

static bool execution_model_has_hit_attribute(spv::ExecutionModel model)
{
	switch (model)
	{
	case spv::ExecutionModelAnyHitKHR:
	case spv::ExecutionModelClosestHitKHR:
	case spv::ExecutionModelIntersectionKHR:
		return true;

	default:
		return false;
	}
}